

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse_Args.cpp
# Opt level: O0

void __thiscall
Nova::Parse_Args::Add_Double_Argument
          (Parse_Args *this,string *arg_str,double default_value,string *val_name,string *desc)

{
  Arg_Data local_168;
  string *local_30;
  string *desc_local;
  string *val_name_local;
  double default_value_local;
  string *arg_str_local;
  Parse_Args *this_local;
  
  local_30 = desc;
  desc_local = val_name;
  val_name_local = (string *)default_value;
  default_value_local = (double)arg_str;
  arg_str_local = (string *)this;
  Arg_Data::Arg_Data(&local_168,arg_str,val_name,desc,default_value);
  std::vector<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>::push_back
            (&this->arg_data_list,&local_168);
  Arg_Data::~Arg_Data(&local_168);
  return;
}

Assistant:

void Parse_Args::
Add_Double_Argument(const std::string& arg_str,double default_value,const std::string& val_name,const std::string& desc)
{
    arg_data_list.push_back(Arg_Data(arg_str,val_name,desc,default_value));
}